

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_default_alloc
              (void *alloc_context,flatcc_iovec_t *b,size_t request,int zero_fill,int hint)

{
  void *pvVar1;
  ulong local_40;
  size_t n;
  void *p;
  int hint_local;
  int zero_fill_local;
  size_t request_local;
  flatcc_iovec_t *b_local;
  void *alloc_context_local;
  
  if (request == 0) {
    if (b->iov_base != (void *)0x0) {
      free(b->iov_base);
      b->iov_base = (void *)0x0;
      b->iov_len = 0;
    }
    alloc_context_local._4_4_ = 0;
  }
  else {
    switch(hint) {
    case 1:
      local_40 = 0x100;
      break;
    default:
      local_40 = 0x20;
      break;
    case 4:
      local_40 = 0x120;
      break;
    case 5:
      local_40 = request;
      break;
    case 7:
      local_40 = 0x40;
    }
    for (; local_40 < request; local_40 = local_40 << 1) {
    }
    if ((b->iov_len < request) || (b->iov_len >> 1 < local_40)) {
      pvVar1 = realloc(b->iov_base,local_40);
      if (pvVar1 == (void *)0x0) {
        alloc_context_local._4_4_ = -1;
      }
      else {
        if ((zero_fill != 0) && (b->iov_len < local_40)) {
          memset((void *)((long)pvVar1 + b->iov_len),0,local_40 - b->iov_len);
        }
        b->iov_base = pvVar1;
        b->iov_len = local_40;
        alloc_context_local._4_4_ = 0;
      }
    }
    else {
      alloc_context_local._4_4_ = 0;
    }
  }
  return alloc_context_local._4_4_;
}

Assistant:

int flatcc_builder_default_alloc(void *alloc_context, iovec_t *b, size_t request, int zero_fill, int hint)
{
    void *p;
    size_t n;

    (void)alloc_context;

    if (request == 0) {
        if (b->iov_base) {
            FLATCC_BUILDER_FREE(b->iov_base);
            b->iov_base = 0;
            b->iov_len = 0;
        }
        return 0;
    }
    switch (hint) {
    case flatcc_builder_alloc_ds:
        n = 256;
        break;
    case flatcc_builder_alloc_ht:
        /* Should be exact size, or space size is just wasted. */
        n = request;
        break;
    case flatcc_builder_alloc_fs:
        n = sizeof(__flatcc_builder_frame_t) * 8;
        break;
    case flatcc_builder_alloc_us:
        n = 64;
        break;
    default:
        /*
         * We have many small structures - vs stack for tables with few
         * elements, and few offset fields in patch log. No need to
         * overallocate in case of busy small messages.
         */
        n = 32;
        break;
    }
    while (n < request) {
        n *= 2;
    }
    if (request <= b->iov_len && b->iov_len / 2 >= n) {
        /* Add hysteresis to shrink. */
        return 0;
    }
    if (!(p = FLATCC_BUILDER_REALLOC(b->iov_base, n))) {
        return -1;
    }
    /* Realloc might also shrink. */
    if (zero_fill && b->iov_len < n) {
        memset((uint8_t *)p + b->iov_len, 0, n - b->iov_len);
    }
    b->iov_base = p;
    b->iov_len = n;
    return 0;
}